

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void CompoundFile::loadSATSector
               (istream *stream,
               vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *sat,
               int32_t sectorSize)

{
  int in_EDX;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RSI;
  int32_t secID;
  int32_t i;
  int32_t secIDCount;
  value_type *in_stack_ffffffffffffffc8;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  int32_t id;
  uint uVar1;
  
  for (uVar1 = 0; (int)uVar1 < in_EDX / 4; uVar1 = uVar1 + 1) {
    id = 0;
    readData<int>((istream *)((ulong)uVar1 << 0x20),in_stack_ffffffffffffffd8,
                  (size_t)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = in_RSI;
    SecID::SecID((SecID *)&stack0xffffffffffffffdc,id);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

inline void
loadSATSector( std::istream & stream, std::vector< SecID > & sat,
	int32_t sectorSize )
{
	const int32_t secIDCount = sectorSize / 4;

	for( int32_t i = 0; i < secIDCount; ++i )
	{
		int32_t secID = 0;

		readData( stream, secID, 4 );

		sat.push_back( secID );
	}
}